

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_printer.cpp
# Opt level: O0

void printGraphVizToFile(Graph *G,string *filename)

{
  edge_descriptor e_00;
  type_conflict1 tVar1;
  bool bVar2;
  ostream *poVar3;
  reference rVar4;
  unsigned_long uVar5;
  edge_bundled *peVar6;
  directed_edges_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>
  *g_;
  value_type local_3d0;
  value_type local_3b8;
  value_type local_3a0;
  tuples local_388 [16];
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_378;
  undefined1 local_2e8 [8];
  EdgeIterator e_end;
  EdgeIterator e;
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_248;
  integer_iterator<unsigned_long> local_238;
  VertexIterator v_end;
  VertexIterator v;
  ostream local_218 [8];
  ofstream gout;
  string *filename_local;
  Graph *G_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  poVar3 = std::operator<<(local_218,"digraph G");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_218,"{");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&v_end);
  boost::range_detail::integer_iterator<unsigned_long>::integer_iterator(&local_238);
  local_248 = boost::
              vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>>
                        ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                          *)G);
  boost::tuples::
  tie<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>
            ((tuples *)&e.m_g,&v_end,&local_238);
  boost::tuples::
  tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::range_detail::integer_iterator<unsigned_long>&,boost::range_detail::integer_iterator<unsigned_long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&e.m_g,&local_248);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&v_end,
                       (iterator_facade<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long>
                        *)&local_238);
    if (!tVar1) break;
    poVar3 = std::operator<<(local_218,"   ");
    rVar4 = boost::iterators::detail::
            iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
            ::operator*((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                         *)&v_end);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
    poVar3 = std::operator<<(poVar3,";");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    boost::iterators::detail::
    iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::range_detail::integer_iterator<unsigned_long>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_unsigned_long,_long,_false,_false>
                  *)&v_end);
  }
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)&e_end.m_g);
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)local_2e8);
  boost::
  edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>::config>
            (&local_378,(boost *)G,g_);
  boost::tuples::
  tie<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>>
            (local_388,
             (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)&e_end.m_g,
             (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)local_2e8);
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_388,&local_378);
  std::
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  ::~pair(&local_378);
  while( true ) {
    bVar2 = boost::detail::
            adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
            ::operator!=((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                          *)&e_end.m_g,(self *)local_2e8);
    if (!bVar2) break;
    poVar3 = std::operator<<(local_218,"   ");
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*(&local_3a0,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                 *)&e_end.m_g);
    uVar5 = boost::
            source<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                      (&local_3a0.super_edge_base<boost::directed_tag,_unsigned_long>,G);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
    poVar3 = std::operator<<(poVar3," -> ");
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*(&local_3b8,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                 *)&e_end.m_g);
    uVar5 = boost::
            target<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                      (&local_3b8.super_edge_base<boost::directed_tag,_unsigned_long>,G);
    std::ostream::operator<<(poVar3,uVar5);
    poVar3 = std::operator<<(local_218," [label=");
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator*(&local_3d0,
                (adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                 *)&e_end.m_g);
    e_00.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         local_3d0.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    e_00.super_edge_base<boost::directed_tag,_unsigned_long>.m_source =
         local_3d0.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    e_00.m_eproperty = local_3d0.m_eproperty;
    peVar6 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](G,e_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,peVar6->weight);
    poVar3 = std::operator<<(poVar3,"];");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    boost::detail::
    adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
    ::operator++((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
                  *)&e_end.m_g);
  }
  poVar3 = std::operator<<(local_218,"}");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::~adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)local_2e8);
  boost::detail::
  adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
  ::~adj_list_edge_iterator
            ((adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>
              *)&e_end.m_g);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void printGraphVizToFile(Graph G, std::string filename)
{
    std::ofstream gout;
    gout.open(filename);

    gout << "digraph G" << std::endl;
    gout << "{" << std::endl;

    VertexIterator v, v_end;
    for(boost::tie(v, v_end) = boost::vertices(G); v != v_end; ++v) {
        gout << "   " << *v << ";" << std::endl;
    }

    EdgeIterator e, e_end;
    for(boost::tie(e, e_end) = boost::edges(G); e != e_end; ++e) {
        gout << "   " << source(*e, G) << " -> " << target(*e, G);
        gout << " [label=" << G[*e].weight << "];" << std::endl;
    }

    gout << "}" << std::endl;
}